

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

uint8_t * JS_WriteObject2(JSContext *ctx,size_t *psize,JSValue obj,int flags,uint8_t ***psab_tab,
                         size_t *psab_tab_len)

{
  DynBuf *s;
  JSRuntime *opaque;
  int iVar1;
  long lVar2;
  size_t __n;
  BCWriterState ss;
  DynBuf local_f8;
  BCWriterState local_c0;
  
  s = &local_c0.dbuf;
  memset(s,0,0x88);
  local_c0._56_4_ =
       (flags & 8U) << 0x15 | (flags & 4U) << 0xe | (uint)flags >> 1 & 1 | (flags & 1U) << 8;
  local_c0.first_atom = 0xd2;
  if ((flags & 1U) == 0) {
    local_c0.first_atom = 1;
  }
  local_c0.ctx = ctx;
  dbuf_init2(s,ctx->rt,js_realloc_rt);
  local_c0.object_list.hash_table = (uint32_t *)0x0;
  local_c0.object_list.hash_size = 0;
  local_c0.object_list._28_4_ = 0;
  local_c0.object_list.object_tab = (JSObjectListEntry *)0x0;
  local_c0.object_list.object_count = 0;
  local_c0.object_list.object_size = 0;
  iVar1 = JS_WriteObjectRec(&local_c0,obj);
  if (iVar1 == 0) {
    opaque = (local_c0.ctx)->rt;
    local_f8.buf = (uint8_t *)CONCAT44(local_c0.dbuf.buf._4_4_,local_c0.dbuf.buf._0_4_);
    local_f8.size = CONCAT44(local_c0.dbuf.size._4_4_,(int)local_c0.dbuf.size);
    local_f8.allocated_size =
         CONCAT44(local_c0.dbuf.allocated_size._4_4_,(undefined4)local_c0.dbuf.allocated_size);
    local_f8._28_4_ = local_c0.dbuf._28_4_;
    local_f8.error = local_c0.dbuf.error;
    local_f8.realloc_func =
         (DynBufReallocFunc *)
         CONCAT44(local_c0.dbuf.realloc_func._4_4_,local_c0.dbuf.realloc_func._0_4_);
    local_f8.opaque = (void *)CONCAT44(local_c0.dbuf.opaque._4_4_,local_c0.dbuf.opaque._0_4_);
    dbuf_init2(s,opaque,js_realloc_rt);
    dbuf_putc(s,(local_c0._56_1_ != '\0') * '@' + '\x01');
    dbuf_put_leb128(s,local_c0.idx_to_atom_count);
    if (0 < local_c0.idx_to_atom_count) {
      lVar2 = 0;
      do {
        JS_WriteString(&local_c0,opaque->atom_array[local_c0.idx_to_atom[lVar2]]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < local_c0.idx_to_atom_count);
    }
    __n = (size_t)(int)local_c0.dbuf.size;
    iVar1 = dbuf_realloc(&local_f8,local_f8.size + __n);
    if (iVar1 == 0) {
      memmove(local_f8.buf + __n,local_f8.buf,local_f8.size);
      memcpy(local_f8.buf,(void *)CONCAT44(local_c0.dbuf.buf._4_4_,local_c0.dbuf.buf._0_4_),__n);
      local_f8.size = local_f8.size + __n;
      dbuf_free(s);
      local_c0.dbuf.realloc_func._0_4_ = local_f8.realloc_func._0_4_;
      local_c0.dbuf.realloc_func._4_4_ = local_f8.realloc_func._4_4_;
      local_c0.dbuf.opaque._0_4_ = local_f8.opaque._0_4_;
      local_c0.dbuf.opaque._4_4_ = local_f8.opaque._4_4_;
      local_c0.dbuf.allocated_size._0_4_ = (undefined4)local_f8.allocated_size;
      local_c0.dbuf.allocated_size._4_4_ = local_f8.allocated_size._4_4_;
      local_c0.dbuf.error = local_f8.error;
      local_c0.dbuf._28_4_ = local_f8._28_4_;
      local_c0.dbuf.buf._0_4_ = local_f8.buf._0_4_;
      local_c0.dbuf.buf._4_4_ = local_f8.buf._4_4_;
      local_c0.dbuf.size._0_4_ = (undefined4)local_f8.size;
      local_c0.dbuf.size._4_4_ = local_f8.size._4_4_;
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_c0.object_list.object_tab);
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_c0.object_list.hash_table);
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_c0.atom_to_idx);
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_c0.idx_to_atom);
      *psize = CONCAT44(local_c0.dbuf.size._4_4_,(int)local_c0.dbuf.size);
      if (psab_tab != (uint8_t ***)0x0) {
        *psab_tab = local_c0.sab_tab;
      }
      if (psab_tab_len != (size_t *)0x0) {
        *psab_tab_len = (long)local_c0.sab_tab_len;
      }
      return (uint8_t *)CONCAT44(local_c0.dbuf.buf._4_4_,local_c0.dbuf.buf._0_4_);
    }
    dbuf_free(&local_f8);
  }
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_c0.object_list.object_tab);
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_c0.object_list.hash_table);
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_c0.atom_to_idx);
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_c0.idx_to_atom);
  dbuf_free(s);
  *psize = 0;
  if (psab_tab != (uint8_t ***)0x0) {
    *psab_tab = (uint8_t **)0x0;
  }
  if (psab_tab_len != (size_t *)0x0) {
    *psab_tab_len = 0;
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *JS_WriteObject2(JSContext *ctx, size_t *psize, JSValueConst obj,
                         int flags, uint8_t ***psab_tab, size_t *psab_tab_len)
{
    BCWriterState ss, *s = &ss;

    memset(s, 0, sizeof(*s));
    s->ctx = ctx;
    /* XXX: byte swapped output is untested */
    s->byte_swap = ((flags & JS_WRITE_OBJ_BSWAP) != 0);
    s->allow_bytecode = ((flags & JS_WRITE_OBJ_BYTECODE) != 0);
    s->allow_sab = ((flags & JS_WRITE_OBJ_SAB) != 0);
    s->allow_reference = ((flags & JS_WRITE_OBJ_REFERENCE) != 0);
    /* XXX: could use a different version when bytecode is included */
    if (s->allow_bytecode)
        s->first_atom = JS_ATOM_END;
    else
        s->first_atom = 1;
    js_dbuf_init(ctx, &s->dbuf);
    js_object_list_init(&s->object_list);
    
    if (JS_WriteObjectRec(s, obj))
        goto fail;
    if (JS_WriteObjectAtoms(s))
        goto fail;
    js_object_list_end(ctx, &s->object_list);
    js_free(ctx, s->atom_to_idx);
    js_free(ctx, s->idx_to_atom);
    *psize = s->dbuf.size;
    if (psab_tab)
        *psab_tab = s->sab_tab;
    if (psab_tab_len)
        *psab_tab_len = s->sab_tab_len;
    return s->dbuf.buf;
 fail:
    js_object_list_end(ctx, &s->object_list);
    js_free(ctx, s->atom_to_idx);
    js_free(ctx, s->idx_to_atom);
    dbuf_free(&s->dbuf);
    *psize = 0;
    if (psab_tab)
        *psab_tab = NULL;
    if (psab_tab_len)
        *psab_tab_len = 0;
    return NULL;
}